

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,int argc,char **argv,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  bool bVar1;
  long lVar2;
  string local_80;
  undefined1 local_60 [8];
  string doubleDash;
  allocator local_31;
  
  doubleDash.field_2._8_8_ = tokens;
  std::__cxx11::string::string((string *)local_60,"--",&local_31);
  for (lVar2 = 1; lVar2 < argc; lVar2 = lVar2 + 1) {
    bVar1 = std::operator!=(argv[lVar2],
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_60);
    if (!bVar1) break;
    std::__cxx11::string::string((string *)&local_80,argv[lVar2],&local_31);
    parseIntoTokens(this,&local_80,
                    (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                     *)doubleDash.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void parseIntoTokens( int argc, char const * const * argv, std::vector<Parser::Token>& tokens ) const {
            const std::string doubleDash = "--";
            for( int i = 1; i < argc && argv[i] != doubleDash; ++i )
                parseIntoTokens( argv[i] , tokens);
        }